

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObject::InitializeFromExistingSharedData
          (CSharedMemoryObject *this,CPalThread *pthr,CObjectAttributes *poa)

{
  void *__dest;
  DWORD DVar1;
  int iVar2;
  LPVOID pvVar3;
  WCHAR *pWVar4;
  char16_t *string1;
  LPVOID __src;
  OBJECTINITROUTINE p_Var5;
  VOID *pv;
  WCHAR *wsz_1;
  WCHAR *wsz;
  SHMObjData *psmod;
  PAL_ERROR palError;
  CObjectAttributes *poa_local;
  CPalThread *pthr_local;
  CSharedMemoryObject *this_local;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0xa8);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (poa == (CObjectAttributes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0xa9);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  this->m_ObjectDomain = SharedObject;
  if (this->m_shmod == 0) {
    fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0xb8);
    fprintf(_stderr,"Expression: SHMNULL != m_shmod\n");
  }
  pvVar3 = SHMPtrToPtr(this->m_shmod);
  if (pvVar3 == (LPVOID)0x0) {
    fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0xbd);
    fprintf(_stderr,"Unable to map shared object data\n");
    psmod._4_4_ = 0x54f;
  }
  else {
    DVar1 = CPalString::GetStringLength(&poa->sObjectName);
    if ((DVar1 == 0) && (*(int *)((long)pvVar3 + 0x34) != 0)) {
      pWVar4 = (WCHAR *)SHMPtrToPtr(*(SHMPTR *)((long)pvVar3 + 0x18));
      if (pWVar4 == (WCHAR *)0x0) {
        fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                ,0xd6);
        fprintf(_stderr,"Unable to map object name\n");
        psmod._4_4_ = 0x54f;
        goto LAB_003b17a4;
      }
      CPalString::SetStringWithLength(&poa->sObjectName,pWVar4,*(DWORD *)((long)pvVar3 + 0x34));
    }
    else if (*(int *)((long)pvVar3 + 0x34) != 0) {
      string1 = (char16_t *)SHMPtrToPtr(*(SHMPTR *)((long)pvVar3 + 0x18));
      if (string1 == (char16_t *)0x0) {
        fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                ,0xe5);
        fprintf(_stderr,"Expression: NULL != wsz\n");
      }
      pWVar4 = CPalString::GetString(&poa->sObjectName);
      iVar2 = PAL_wcscmp(string1,pWVar4);
      if (iVar2 != 0) {
        fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                ,0xe6);
        fprintf(_stderr,"Expression: 0 == PAL_wcscmp(wsz, poa->sObjectName.GetString())\n");
      }
    }
    psmod._4_4_ = CPalObjectBase::Initialize(&this->super_CPalObjectBase,pthr,poa);
    if (psmod._4_4_ == 0) {
      if (*(long *)((long)pvVar3 + 0x20) != 0) {
        __src = SHMPtrToPtr(*(SHMPTR *)((long)pvVar3 + 0x20));
        if (__src == (LPVOID)0x0) {
          fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                  ,0xf9);
          fprintf(_stderr,"Unable to map object immutable data\n");
          psmod._4_4_ = 0x54f;
          goto LAB_003b17a4;
        }
        __dest = (this->super_CPalObjectBase).m_pvImmutableData;
        DVar1 = CObjectType::GetImmutableDataSize((this->super_CPalObjectBase).m_pot);
        memcpy(__dest,__src,(ulong)DVar1);
      }
      if (*(long *)((long)pvVar3 + 0x28) != 0) {
        pvVar3 = SHMPtrToPtr(*(SHMPTR *)((long)pvVar3 + 0x28));
        this->m_pvSharedData = pvVar3;
        if (this->m_pvSharedData == (VOID *)0x0) {
          fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                  ,0x104);
          fprintf(_stderr,"Unable to map object shared data\n");
          psmod._4_4_ = 0x54f;
          goto LAB_003b17a4;
        }
      }
      p_Var5 = CObjectType::GetObjectInitRoutine((this->super_CPalObjectBase).m_pot);
      if (p_Var5 != (OBJECTINITROUTINE)0x0) {
        p_Var5 = CObjectType::GetObjectInitRoutine((this->super_CPalObjectBase).m_pot);
        psmod._4_4_ = (*p_Var5)(pthr,(this->super_CPalObjectBase).m_pot,
                                (this->super_CPalObjectBase).m_pvImmutableData,this->m_pvSharedData,
                                (this->super_CPalObjectBase).m_pvLocalData);
      }
    }
  }
LAB_003b17a4:
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return psmod._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObject::InitializeFromExistingSharedData(
    CPalThread *pthr,
    CObjectAttributes *poa
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMObjData *psmod = NULL;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != poa);

    ENTRY("CSharedMemoryObject::InitializeFromExistingSharedData"
        "(this = %p, pthr = %p, poa = %p)\n",
        this,
        pthr,
        poa
        );

    //
    // This object is obviously shared...
    //

    m_ObjectDomain = SharedObject;

    _ASSERTE(SHMNULL != m_shmod);

    psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, m_shmod);
    if (NULL == psmod)
    {
        ASSERT("Unable to map shared object data\n");
        palError = ERROR_INTERNAL_ERROR;
        goto InitializeFromExistingSharedDataExit;
    }

    //
    // When we're being called on the duplicate handle path the passed
    // in object attributes likely won't have an object name in it.
    // If there is an object name in the shared data place that in the
    // object attributes so that the constructed object has a local copy
    // of the name
    //

    if (0 == poa->sObjectName.GetStringLength()
        && 0 != psmod->dwNameLength)
    {
        WCHAR *wsz;

        wsz = SHMPTR_TO_TYPED_PTR(WCHAR, psmod->shmObjName);
        if (NULL != wsz)
        {
            poa->sObjectName.SetStringWithLength(wsz, psmod->dwNameLength);
        }
        else
        {
            ASSERT("Unable to map object name\n");
            palError = ERROR_INTERNAL_ERROR;
            goto InitializeFromExistingSharedDataExit;
        }
    }
#if _DEBUG
    else if (0 != psmod->dwNameLength)
    {
        WCHAR *wsz;

        //
        // Verify that the names are consistent
        //

        wsz = SHMPTR_TO_TYPED_PTR(WCHAR, psmod->shmObjName);
        _ASSERTE(NULL != wsz);
        _ASSERTE(0 == PAL_wcscmp(wsz, poa->sObjectName.GetString()));
    }
#endif // debug

    palError = CPalObjectBase::Initialize(pthr, poa);
    if (NO_ERROR != palError)
    {
        goto InitializeFromExistingSharedDataExit;
    }

    if (SHMNULL != psmod->shmObjImmutableData)
    {
        VOID *pv = SHMPTR_TO_TYPED_PTR(VOID, psmod->shmObjImmutableData);
        if (NULL != pv)
        {
            memcpy(m_pvImmutableData, pv, m_pot->GetImmutableDataSize());
        }
        else
        {
            ASSERT("Unable to map object immutable data\n");
            palError = ERROR_INTERNAL_ERROR;
            goto InitializeFromExistingSharedDataExit;
        }
    }

    if (SHMNULL != psmod->shmObjSharedData)
    {
        m_pvSharedData = SHMPTR_TO_TYPED_PTR(VOID, psmod->shmObjSharedData);
        if (NULL == m_pvSharedData)
        {
            ASSERT("Unable to map object shared data\n");
            palError = ERROR_INTERNAL_ERROR;
            goto InitializeFromExistingSharedDataExit;
        }
    }

    if (NULL != m_pot->GetObjectInitRoutine())
    {
        palError = (*m_pot->GetObjectInitRoutine())(
            pthr,
            m_pot,
            m_pvImmutableData,
            m_pvSharedData,
            m_pvLocalData
            );
    }

InitializeFromExistingSharedDataExit:

    LOGEXIT("CSharedMemoryObject::InitalizeFromExistingSharedData returns %d\n", palError);

    return palError;
}